

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O0

int Amap_LibertyCellIsFlop(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Amap_Item_t *local_28;
  Amap_Item_t *pAttr;
  Amap_Item_t *pCell_local;
  Amap_Tree_t *p_local;
  
  local_28 = Amap_LibertyItem(p,pCell->Child);
  while( true ) {
    if (local_28 == (Amap_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Amap_LibertyCompare(p,local_28->Key,"ff");
    if ((iVar1 == 0) || (iVar1 = Amap_LibertyCompare(p,local_28->Key,"latch"), iVar1 == 0)) break;
    local_28 = Amap_LibertyItem(p,local_28->Next);
  }
  return 1;
}

Assistant:

int Amap_LibertyCellIsFlop( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pAttr;
    Amap_ItemForEachChild( p, pCell, pAttr )
        if ( !Amap_LibertyCompare(p, pAttr->Key, "ff") ||
             !Amap_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}